

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageColorReplace(Image *image,Color color,Color replace)

{
  int newFormat;
  int i;
  Color *pCVar1;
  long lVar2;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar1 = LoadImageColors(*image);
    for (lVar2 = 0; lVar2 < (long)image->height * (long)image->width; lVar2 = lVar2 + 1) {
      if (((pCVar1[lVar2].r == color.r) && (pCVar1[lVar2].g == color.g)) &&
         ((pCVar1[lVar2].b == color.b && ((uint)color >> 0x18 == (uint)pCVar1[lVar2].a)))) {
        pCVar1[lVar2].r = replace.r;
        pCVar1[lVar2].g = replace.g;
        pCVar1[lVar2].b = replace.b;
        pCVar1[lVar2].a = replace.a;
      }
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar1;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageColorReplace(Image *image, Color color, Color replace)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        if ((pixels[i].r == color.r) &&
            (pixels[i].g == color.g) &&
            (pixels[i].b == color.b) &&
            (pixels[i].a == color.a))
        {
            pixels[i].r = replace.r;
            pixels[i].g = replace.g;
            pixels[i].b = replace.b;
            pixels[i].a = replace.a;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}